

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O2

void __thiscall gv_visitor::visit(gv_visitor *this,BiggerExpr *ptr)

{
  Expr *pEVar1;
  string local_48;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,">",&local_21);
  box(this,ptr,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pEVar1 = ptr->first;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"left",&local_21);
  arrow(this,ptr,pEVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (**(ptr->first->super_Base)._vptr_Base)(ptr->first,this);
  pEVar1 = ptr->second;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"right",&local_21);
  arrow(this,ptr,pEVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (**(ptr->second->super_Base)._vptr_Base)(ptr->second,this);
  return;
}

Assistant:

void gv_visitor::visit(BiggerExpr* ptr) {
    box(ptr, ">");
    arrow(ptr, ptr->first, "left");
    ptr->first->accept(this);
    arrow(ptr, ptr->second, "right");
    ptr->second->accept(this);
}